

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::replace_prelu_with_leaky_relu(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  int iVar3;
  Layer *pLVar4;
  long lVar5;
  long lVar6;
  ParamDict pd;
  ParamDict local_40;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar6 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    lVar6 = lVar6 >> 3;
    lVar5 = 0;
    do {
      iVar3 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar5]->type);
      if ((iVar3 == 0) &&
         (pLVar2 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar5], *(int *)&pLVar2[1]._vptr_Layer == 1)) {
        fprintf(_stderr,"replace_prelu_with_leaky_relu %s\n",(pLVar2->name)._M_dataplus._M_p);
        pLVar4 = ncnn::create_layer_cpu("ReLU");
        std::__cxx11::string::_M_replace
                  ((ulong)&pLVar4->type,0,(char *)(pLVar4->type)._M_string_length,0x5fd692);
        std::__cxx11::string::_M_assign((string *)&pLVar4->name);
        std::vector<int,_std::allocator<int>_>::operator=(&pLVar4->bottoms,&pLVar2->bottoms);
        std::vector<int,_std::allocator<int>_>::operator=(&pLVar4->tops,&pLVar2->tops);
        ncnn::ParamDict::ParamDict(&local_40);
        (*pLVar4->_vptr_Layer[2])(pLVar4,&local_40);
        *(undefined4 *)&pLVar4[1]._vptr_Layer = **(undefined4 **)&pLVar2[1].one_blob_only;
        (((this->super_ModelWriter).layers)->
        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
        super__Vector_impl_data._M_start[lVar5] = pLVar4;
        if (pLVar2 != (Layer *)0x0) {
          (*pLVar2->_vptr_Layer[1])(pLVar2);
        }
        ncnn::ParamDict::~ParamDict(&local_40);
      }
      lVar5 = lVar5 + 1;
    } while (lVar6 + (ulong)(lVar6 == 0) != lVar5);
  }
  return 0;
}

Assistant:

int NetOptimize::replace_prelu_with_leaky_relu()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "PReLU")
            continue;

        ncnn::PReLU* prelu = (ncnn::PReLU*)layers[i];
        if (prelu->num_slope != 1)
            continue;

        fprintf(stderr, "replace_prelu_with_leaky_relu %s\n", prelu->name.c_str());

        ncnn::ReLU* relu = (ncnn::ReLU*)ncnn::create_layer_cpu("ReLU");

        relu->type = "ReLU";
        relu->name = prelu->name;
        relu->bottoms = prelu->bottoms;
        relu->tops = prelu->tops;

        ncnn::ParamDict pd;
        relu->load_param(pd);

        relu->slope = prelu->slope_data[0];

        layers[i] = relu;
        delete prelu;
    }

    return 0;
}